

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

Promise<kj::Own<capnp::ClientHook>_> __thiscall
kj::Promise<kj::Own<capnp::ClientHook>_>::exclusiveJoin
          (Promise<kj::Own<capnp::ClientHook>_> *this,Promise<kj::Own<capnp::ClientHook>_> *other)

{
  Own<kj::_::PromiseNode> *params;
  Own<kj::_::PromiseNode> *params_1;
  Own<kj::_::PromiseNode> *in_RDX;
  PromiseNode *extraout_RDX;
  Promise<kj::Own<capnp::ClientHook>_> PVar1;
  Own<kj::_::ExclusiveJoinPromiseNode> local_40;
  Own<kj::_::PromiseNode> local_30;
  Own<kj::_::PromiseNode> *local_20;
  Promise<kj::Own<capnp::ClientHook>_> *other_local;
  Promise<kj::Own<capnp::ClientHook>_> *this_local;
  
  local_20 = in_RDX;
  other_local = other;
  this_local = this;
  params = mv<kj::Own<kj::_::PromiseNode>>((Own<kj::_::PromiseNode> *)other);
  params_1 = mv<kj::Own<kj::_::PromiseNode>>(local_20);
  heap<kj::_::ExclusiveJoinPromiseNode,kj::Own<kj::_::PromiseNode>,kj::Own<kj::_::PromiseNode>>
            ((kj *)&local_40,params,params_1);
  Own<kj::_::PromiseNode>::Own<kj::_::ExclusiveJoinPromiseNode,void>(&local_30,&local_40);
  Promise(this,false,&local_30);
  Own<kj::_::PromiseNode>::~Own(&local_30);
  Own<kj::_::ExclusiveJoinPromiseNode>::~Own(&local_40);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::Own<capnp::ClientHook>_>)PVar1.super_PromiseBase.node;
}

Assistant:

Promise<T> Promise<T>::exclusiveJoin(Promise<T>&& other) {
  return Promise(false, heap<_::ExclusiveJoinPromiseNode>(kj::mv(node), kj::mv(other.node)));
}